

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

void __thiscall ipx::Model::PrintCoefficientRange(Model *this,Control *control)

{
  pointer piVar1;
  size_t sVar2;
  ostream *poVar3;
  double *pdVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  double *pdVar8;
  ulong uVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  double local_238;
  double local_228;
  string local_218;
  double local_1f8;
  undefined8 uStack_1f0;
  string local_1e8;
  string local_1c8;
  stringstream h_logging_stream;
  undefined1 local_198 [376];
  
  piVar1 = (this->A_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = (int)((ulong)((long)(this->A_).colptr_.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)piVar1) >> 2) - 1;
  uVar9 = 0;
  uVar7 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar7 = uVar9;
  }
  local_238 = INFINITY;
  local_228 = 0.0;
  for (; uVar9 != uVar7; uVar9 = uVar9 + 1) {
    for (lVar10 = (long)piVar1[uVar9]; lVar10 < piVar1[uVar9 + 1]; lVar10 = lVar10 + 1) {
      dVar12 = (this->A_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar10];
      if ((dVar12 != 0.0) || (dVar11 = local_228, NAN(dVar12))) {
        dVar11 = ABS(dVar12);
        dVar12 = dVar11;
        if (local_238 <= dVar11) {
          dVar12 = local_238;
        }
        local_238 = dVar12;
        if (dVar11 <= local_228) {
          dVar11 = local_228;
        }
      }
      local_228 = dVar11;
    }
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&h_logging_stream);
  iVar6 = (int)uVar7;
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  local_218._M_string_length = 0;
  local_218.field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringbuf::str((string *)(local_198 + 8));
  std::__cxx11::string::~string((string *)&local_218);
  Textline<char[14]>(&local_218,(char (*) [14])"Matrix range:");
  poVar3 = std::operator<<((ostream *)local_198,(string *)&local_218);
  poVar3 = std::operator<<(poVar3,"[");
  local_1f8 = INFINITY;
  uStack_1f0 = 0;
  Scientific_abi_cxx11_
            (&local_1c8,(ipx *)0x5,(double)(~-(ulong)(INFINITY <= local_238) & (ulong)local_238),0,
             iVar6);
  poVar3 = std::operator<<(poVar3,(string *)&local_1c8);
  poVar3 = std::operator<<(poVar3,", ");
  Scientific_abi_cxx11_(&local_1e8,(ipx *)0x5,local_228,0,iVar6);
  poVar3 = std::operator<<(poVar3,(string *)&local_1e8);
  std::operator<<(poVar3,"]\n");
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_218);
  Control::hLog(control,&h_logging_stream);
  sVar2 = (this->scaled_rhs_)._M_size;
  pdVar4 = (this->scaled_rhs_)._M_data;
  pdVar8 = pdVar4 + sVar2;
  if (sVar2 == 0) {
    pdVar8 = (double *)0x0;
    pdVar4 = (double *)0x0;
  }
  local_228 = 0.0;
  for (; pdVar4 != pdVar8; pdVar4 = pdVar4 + 1) {
    dVar12 = *pdVar4;
    if ((dVar12 != 0.0) || (NAN(dVar12))) {
      dVar12 = ABS(dVar12);
      dVar11 = dVar12;
      if (local_1f8 <= dVar12) {
        dVar11 = local_1f8;
      }
      if (dVar12 <= local_228) {
        dVar12 = local_228;
      }
      uStack_1f0 = 0;
      local_228 = dVar12;
      local_1f8 = dVar11;
    }
  }
  Textline<char[11]>(&local_218,(char (*) [11])"RHS range:");
  iVar6 = (int)pdVar8;
  poVar3 = std::operator<<((ostream *)local_198,(string *)&local_218);
  poVar3 = std::operator<<(poVar3,"[");
  local_238 = INFINITY;
  Scientific_abi_cxx11_
            (&local_1c8,(ipx *)0x5,(double)(~-(ulong)(INFINITY <= local_1f8) & (ulong)local_1f8),0,
             iVar6);
  poVar3 = std::operator<<(poVar3,(string *)&local_1c8);
  poVar3 = std::operator<<(poVar3,", ");
  Scientific_abi_cxx11_(&local_1e8,(ipx *)0x5,local_228,0,iVar6);
  poVar3 = std::operator<<(poVar3,(string *)&local_1e8);
  std::operator<<(poVar3,"]\n");
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_218);
  Control::hLog(control,&h_logging_stream);
  sVar2 = (this->scaled_obj_)._M_size;
  pdVar4 = (this->scaled_obj_)._M_data;
  pdVar8 = pdVar4 + sVar2;
  if (sVar2 == 0) {
    pdVar8 = (double *)0x0;
    pdVar4 = (double *)0x0;
  }
  local_1f8 = 0.0;
  for (; pdVar4 != pdVar8; pdVar4 = pdVar4 + 1) {
    dVar12 = *pdVar4;
    if ((dVar12 != 0.0) || (dVar11 = local_1f8, NAN(dVar12))) {
      dVar11 = ABS(dVar12);
      dVar12 = dVar11;
      if (local_238 <= dVar11) {
        dVar12 = local_238;
      }
      local_238 = dVar12;
      if (dVar11 <= local_1f8) {
        dVar11 = local_1f8;
      }
    }
    local_1f8 = dVar11;
  }
  Textline<char[17]>(&local_218,(char (*) [17])"Objective range:");
  iVar6 = (int)pdVar8;
  poVar3 = std::operator<<((ostream *)local_198,(string *)&local_218);
  poVar3 = std::operator<<(poVar3,"[");
  local_228 = INFINITY;
  Scientific_abi_cxx11_
            (&local_1c8,(ipx *)0x5,(double)(~-(ulong)(INFINITY <= local_238) & (ulong)local_238),0,
             iVar6);
  poVar3 = std::operator<<(poVar3,(string *)&local_1c8);
  poVar3 = std::operator<<(poVar3,", ");
  Scientific_abi_cxx11_(&local_1e8,(ipx *)0x5,local_1f8,0,iVar6);
  poVar3 = std::operator<<(poVar3,(string *)&local_1e8);
  std::operator<<(poVar3,"]\n");
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_218);
  Control::hLog(control,&h_logging_stream);
  sVar2 = (this->scaled_lbuser_)._M_size;
  pdVar4 = (this->scaled_lbuser_)._M_data;
  pdVar8 = pdVar4 + sVar2;
  if (sVar2 == 0) {
    pdVar8 = (double *)0x0;
    pdVar4 = (double *)0x0;
  }
  local_238 = 0.0;
  iVar6 = 0;
  for (; pdVar4 != pdVar8; pdVar4 = pdVar4 + 1) {
    dVar11 = ABS(*pdVar4);
    dVar12 = local_238;
    if ((long)dVar11 - 1U < 0xfffffffffffff ||
        (uint)((ulong)((long)dVar11 + -0x10000000000000) >> 0x35) < 0x3ff) {
      dVar12 = ABS(*pdVar4);
      dVar11 = dVar12;
      if (local_228 <= dVar12) {
        dVar11 = local_228;
      }
      local_228 = dVar11;
      if (dVar12 <= local_238) {
        dVar12 = local_238;
      }
    }
    local_238 = dVar12;
  }
  sVar2 = (this->scaled_ubuser_)._M_size;
  pdVar4 = (this->scaled_ubuser_)._M_data;
  pdVar8 = pdVar4 + sVar2;
  if (sVar2 == 0) {
    pdVar4 = (double *)0x0;
    pdVar8 = (double *)0x0;
  }
  for (; pdVar4 != pdVar8; pdVar4 = pdVar4 + 1) {
    dVar11 = ABS(*pdVar4);
    dVar12 = local_238;
    if ((long)dVar11 - 1U < 0xfffffffffffff ||
        (uint)((ulong)((long)dVar11 + -0x10000000000000) >> 0x35) < 0x3ff) {
      dVar12 = ABS(*pdVar4);
      dVar11 = dVar12;
      if (local_228 <= dVar12) {
        dVar11 = local_228;
      }
      local_228 = dVar11;
      if (dVar12 <= local_238) {
        dVar12 = local_238;
      }
    }
    local_238 = dVar12;
  }
  Textline<char[14]>(&local_218,(char (*) [14])"Bounds range:");
  poVar3 = std::operator<<((ostream *)local_198,(string *)&local_218);
  poVar3 = std::operator<<(poVar3,"[");
  Scientific_abi_cxx11_
            (&local_1c8,(ipx *)0x5,(double)(~-(ulong)(INFINITY <= local_228) & (ulong)local_228),0,
             iVar6);
  poVar3 = std::operator<<(poVar3,(string *)&local_1c8);
  poVar3 = std::operator<<(poVar3,", ");
  Scientific_abi_cxx11_(&local_1e8,(ipx *)0x5,local_238,0,iVar6);
  poVar3 = std::operator<<(poVar3,(string *)&local_1e8);
  std::operator<<(poVar3,"]\n");
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_218);
  Control::hLog(control,&h_logging_stream);
  std::__cxx11::stringstream::~stringstream((stringstream *)&h_logging_stream);
  return;
}

Assistant:

void Model::PrintCoefficientRange(const Control& control) const {
    double amin = INFINITY;
    double amax = 0.0;
    for (Int j = 0; j < A_.cols(); j++) {
        for (Int p = A_.begin(j); p < A_.end(j); p++) {
            double x = A_.value(p);
            if (x != 0.0) {
                amin = std::min(amin, std::abs(x));
                amax = std::max(amax, std::abs(x));
            }
        }
    }
    if (amin == INFINITY)       // no nonzero entries in A_
        amin = 0.0;
    std::stringstream h_logging_stream;
    h_logging_stream.str(std::string());
    h_logging_stream
      << Textline("Matrix range:")
      << "[" << Scientific(amin, 5, 0) << ", "
      << Scientific(amax, 5, 0) << "]\n";
    control.hLog(h_logging_stream);

    double rhsmin = INFINITY;
    double rhsmax = 0.0;
    for (double x : scaled_rhs_) {
        if (x != 0.0) {
            rhsmin = std::min(rhsmin, std::abs(x));
            rhsmax = std::max(rhsmax, std::abs(x));
        }
    }
    if (rhsmin == INFINITY)     // no nonzero entries in rhs
        rhsmin = 0.0;
    h_logging_stream
      << Textline("RHS range:")
      << "[" << Scientific(rhsmin, 5, 0) << ", "
      << Scientific(rhsmax, 5, 0) << "]\n";
    control.hLog(h_logging_stream);

    double objmin = INFINITY;
    double objmax = 0.0;
    for (double x : scaled_obj_) {
        if (x != 0.0) {
            objmin = std::min(objmin, std::abs(x));
            objmax = std::max(objmax, std::abs(x));
        }
    }
    if (objmin == INFINITY)     // no nonzero entries in obj
        objmin = 0.0;
    h_logging_stream
      << Textline("Objective range:")
      << "[" << Scientific(objmin, 5, 0) << ", "
      << Scientific(objmax, 5, 0) << "]\n";
    control.hLog(h_logging_stream);

    double boundmin = INFINITY;
    double boundmax = 0.0;
    for (double x : scaled_lbuser_) {
        if (x != 0.0 && std::isfinite(x)) {
            boundmin = std::min(boundmin, std::abs(x));
            boundmax = std::max(boundmax, std::abs(x));
        }
    }
    for (double x : scaled_ubuser_) {
        if (x != 0.0 && std::isfinite(x)) {
            boundmin = std::min(boundmin, std::abs(x));
            boundmax = std::max(boundmax, std::abs(x));
        }
    }
    if (boundmin == INFINITY)   // no finite nonzeros entries in bounds
        boundmin = 0.0;
    h_logging_stream
      << Textline("Bounds range:")
      << "[" << Scientific(boundmin, 5, 0) << ", "
      << Scientific(boundmax, 5, 0) << "]\n";
    control.hLog(h_logging_stream);
}